

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::ScannersMixin::Print(ScannersMixin *this,DebugWriter *w,char16 *litbuf)

{
  ScannerInfo *this_00;
  int local_24;
  int i;
  char16 *litbuf_local;
  DebugWriter *w_local;
  ScannersMixin *this_local;
  
  DebugWriter::Print(w,L"literals: {");
  for (local_24 = 0; local_24 < this->numLiterals; local_24 = local_24 + 1) {
    if (0 < local_24) {
      DebugWriter::Print(w,L", ");
    }
    this_00 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->(this->infos + local_24)
    ;
    ScannerInfo::Print(this_00,w,litbuf);
  }
  DebugWriter::Print(w,L"}");
  return;
}

Assistant:

void ScannersMixin::Print(DebugWriter* w, const char16* litbuf) const
    {
        w->Print(_u("literals: {"));
        for (int i = 0; i < numLiterals; i++)
        {
            if (i > 0)
            {
                w->Print(_u(", "));
            }
            infos[i]->Print(w, litbuf);
        }
        w->Print(_u("}"));
    }